

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O1

Engine * __thiscall
adios2::core::IO::Open(IO *this,string *name,Mode mode,Comm *comm,char *md,size_t mdsize)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type sVar5;
  pointer pcVar6;
  _Base_ptr p_Var7;
  Engine *pEVar8;
  _Alloc_hider _Var9;
  size_type sVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  bool bVar12;
  int iVar13;
  Mode MVar14;
  iterator iVar15;
  long *plVar16;
  undefined8 *puVar17;
  const_iterator cVar18;
  iterator iVar19;
  char *pcVar20;
  size_type *psVar21;
  Comm *this_00;
  Mode MVar22;
  size_type sVar23;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
  pVar24;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>,_bool>
  pVar25;
  string msg;
  string local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  Mode local_c4;
  Comm *local_c0;
  string engineTypeLC;
  shared_ptr<adios2::core::Engine> local_98;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>>>
  *local_88;
  Comm local_80;
  Comm local_78;
  Comm local_70;
  char *local_68;
  ScopedTimer __var2535;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_c4 = mode;
  local_c0 = comm;
  local_68 = md;
  if (Open(std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,char_const*,unsigned_long)
      ::__var535 == '\0') {
    iVar13 = __cxa_guard_acquire(&Open(std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,char_const*,unsigned_long)
                                  ::__var535);
    if (iVar13 != 0) {
      Open::__var535 = (void *)ps_timer_create_("IO::Open");
      __cxa_guard_release(&Open(std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,char_const*,unsigned_long)
                           ::__var535);
    }
  }
  __var2535.m_timer = Open::__var535;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  local_88 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>>>
              *)&this->m_Engines;
  iVar15 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
                   *)local_88,name);
  p_Var1 = &(this->m_Engines)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar15._M_node == p_Var1) {
    bVar12 = false;
  }
  else {
    bVar12 = Engine::operator_cast_to_bool(*(Engine **)(iVar15._M_node + 2));
  }
  if (bVar12 == true && (_Rb_tree_header *)iVar15._M_node != p_Var1) {
    engineTypeLC._M_dataplus._M_p = (pointer)&engineTypeLC.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&engineTypeLC,"Core","");
    msg._M_dataplus._M_p = (pointer)&msg.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&msg,"IO","");
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Open","");
    std::operator+(&local_e8,"Engine ",name);
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_e8);
    psVar21 = (size_type *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar21) {
      local_108.field_2._M_allocated_capacity = *psVar21;
      local_108.field_2._8_8_ = plVar16[3];
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar21;
      local_108._M_dataplus._M_p = (pointer)*plVar16;
    }
    local_108._M_string_length = plVar16[1];
    *plVar16 = (long)psVar21;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    helper::Throw<std::invalid_argument>(&engineTypeLC,&msg,&local_128,&local_108,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)engineTypeLC._M_dataplus._M_p != &engineTypeLC.field_2) {
      operator_delete(engineTypeLC._M_dataplus._M_p);
    }
  }
  if ((_Rb_tree_header *)iVar15._M_node != p_Var1 && bVar12 == false) {
    pVar24 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
             ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
                            *)local_88,name);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
    ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
                    *)local_88,(_Base_ptr)pVar24.first._M_node,(_Base_ptr)pVar24.second._M_node);
  }
  local_98.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_98.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sVar5 = (this->m_EngineType)._M_string_length;
  engineTypeLC._M_dataplus._M_p = (pointer)&engineTypeLC.field_2;
  pcVar6 = (this->m_EngineType)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&engineTypeLC,pcVar6,pcVar6 + sVar5);
  sVar10 = engineTypeLC._M_string_length;
  _Var9._M_p = engineTypeLC._M_dataplus._M_p;
  if ((sVar5 != 0) && (engineTypeLC._M_string_length != 0)) {
    sVar23 = 0;
    do {
      iVar13 = tolower((int)_Var9._M_p[sVar23]);
      _Var9._M_p[sVar23] = (char)iVar13;
      sVar23 = sVar23 + 1;
    } while (sVar10 != sVar23);
  }
  iVar13 = std::__cxx11::string::compare((char *)&engineTypeLC);
  MVar22 = local_c4;
  if (iVar13 != 0) {
    iVar13 = std::__cxx11::string::compare((char *)&engineTypeLC);
    if (iVar13 == 0) goto LAB_00374a8d;
    iVar13 = std::__cxx11::string::compare((char *)&engineTypeLC);
    if ((sVar5 == 0) || (iVar13 == 0)) goto LAB_00374a8d;
    goto LAB_00374c13;
  }
LAB_00374a8d:
  paVar2 = &msg.field_2;
  msg._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&msg,".h5","");
  bVar12 = helper::EndsWith(name,&msg,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)msg._M_dataplus._M_p != paVar2) {
    operator_delete(msg._M_dataplus._M_p);
  }
  if (bVar12) {
    pcVar20 = "hdf5";
LAB_00374bfd:
    std::__cxx11::string::_M_replace
              ((ulong)&engineTypeLC,0,(char *)engineTypeLC._M_string_length,(ulong)pcVar20);
  }
  else {
    msg._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&msg,".aca","");
    bVar12 = helper::EndsWith(name,&msg,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != paVar2) {
      operator_delete(msg._M_dataplus._M_p);
    }
    if (bVar12) {
      pcVar20 = "campaign";
      goto LAB_00374bfd;
    }
    if ((MVar22 != ReadRandomAccess) && (MVar22 != Read)) {
      pcVar20 = "bp5";
      goto LAB_00374bfd;
    }
    bVar12 = adios2sys::SystemTools::FileIsDirectory(name);
    if (bVar12) {
      helper::BPVersion(name,local_c0,&this->m_TransportsParameters);
      std::__cxx11::string::_M_replace
                ((ulong)&engineTypeLC,0,(char *)engineTypeLC._M_string_length,0x74d66a);
      std::__cxx11::string::push_back((char)&engineTypeLC);
    }
    else {
      pcVar6 = (name->_M_dataplus)._M_p;
      msg._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&msg,pcVar6,pcVar6 + name->_M_string_length);
      std::__cxx11::string::append((char *)&msg);
      bVar12 = adios2sys::SystemTools::FileIsDirectory(&msg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != paVar2) {
        operator_delete(msg._M_dataplus._M_p);
      }
      if (bVar12) {
        pcVar20 = "mhs";
        goto LAB_00374bfd;
      }
      msg._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&msg,".bp","");
      bVar12 = helper::EndsWith(name,&msg,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != paVar2) {
        operator_delete(msg._M_dataplus._M_p);
      }
      if (bVar12) {
        pcVar20 = "bp3";
      }
      else {
        bVar12 = helper::IsHDF5File(name,this,local_c0,&this->m_TransportsParameters);
        pcVar20 = "bp3";
        if (bVar12) {
          pcVar20 = "hdf5";
        }
      }
      std::__cxx11::string::operator=((string *)&engineTypeLC,pcVar20);
    }
  }
LAB_00374c13:
  iVar13 = std::__cxx11::string::compare((char *)&engineTypeLC);
  if (iVar13 == 0) {
    helper::BPVersion(name,local_c0,&this->m_TransportsParameters);
    std::__cxx11::string::_M_replace
              ((ulong)&engineTypeLC,0,(char *)engineTypeLC._M_string_length,0x74d66a);
    std::__cxx11::string::push_back((char)&engineTypeLC);
  }
  iVar13 = std::__cxx11::string::compare((char *)&engineTypeLC);
  if (iVar13 != 0) goto LAB_0037532e;
  if (MVar22 == Sync) {
LAB_00374d9f:
    msg._M_dataplus._M_p = (pointer)&msg.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&msg,"Core","");
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"IO","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Open","");
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"Sync mode is not supported in the inline engine.","");
    helper::Throw<std::runtime_error>(&msg,&local_128,&local_108,&local_e8,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    MVar22 = local_c4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p);
    }
  }
  else if (MVar22 == Append) {
    msg._M_dataplus._M_p = (pointer)&msg.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&msg,"Core","");
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"IO","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Open","");
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"Append mode is not supported in the inline engine.","");
    helper::Throw<std::runtime_error>(&msg,&local_128,&local_108,&local_e8,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    MVar22 = local_c4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p);
    }
    if (MVar22 == Sync) goto LAB_00374d9f;
  }
  if (1 < (this->m_Engines)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    std::operator+(&local_e8,"Failed to add engine ",name);
    puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
    paVar2 = &local_108.field_2;
    psVar21 = puVar17 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar17 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar21) {
      local_108.field_2._M_allocated_capacity = *psVar21;
      local_108.field_2._8_8_ = puVar17[3];
      local_108._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar21;
      local_108._M_dataplus._M_p = (pointer)*puVar17;
    }
    local_108._M_string_length = puVar17[1];
    *puVar17 = psVar21;
    puVar17[1] = 0;
    *(undefined1 *)(puVar17 + 2) = 0;
    plVar16 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_108,(ulong)(this->m_Name)._M_dataplus._M_p);
    paVar3 = &local_128.field_2;
    psVar21 = (size_type *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar21) {
      local_128.field_2._M_allocated_capacity = *psVar21;
      local_128.field_2._8_8_ = plVar16[3];
      local_128._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_128.field_2._M_allocated_capacity = *psVar21;
      local_128._M_dataplus._M_p = (pointer)*plVar16;
    }
    local_128._M_string_length = plVar16[1];
    *plVar16 = (long)psVar21;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_128);
    msg._M_dataplus._M_p = (pointer)&msg.field_2;
    psVar21 = (size_type *)(plVar16 + 2);
    if ((size_type *)*plVar16 == psVar21) {
      msg.field_2._M_allocated_capacity = *psVar21;
      msg.field_2._8_8_ = plVar16[3];
    }
    else {
      msg.field_2._M_allocated_capacity = *psVar21;
      msg._M_dataplus._M_p = (pointer)*plVar16;
    }
    msg._M_string_length = plVar16[1];
    *plVar16 = (long)psVar21;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar3) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    paVar4 = &local_e8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar4) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    std::__cxx11::string::append((char *)&msg);
    std::__cxx11::string::append((char *)&msg);
    local_128._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Core","");
    local_108._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"IO","");
    local_e8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Open","");
    helper::Throw<std::runtime_error>(&local_128,&local_108,&local_e8,&msg,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar4) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar3) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p);
    }
  }
  if ((this->m_Engines)._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
    p_Var7 = (this->m_Engines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pEVar8 = *(Engine **)(p_Var7 + 2);
    p_Var7 = p_Var7[2]._M_parent;
    if (p_Var7 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&p_Var7->_M_parent = *(int *)&p_Var7->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&p_Var7->_M_parent = *(int *)&p_Var7->_M_parent + 1;
      }
    }
    MVar14 = Engine::OpenMode(pEVar8);
    if (MVar14 == MVar22) {
      std::operator+(&local_e8,"The previously added engine ",&pEVar8->m_Name);
      puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
      paVar2 = &local_108.field_2;
      psVar21 = puVar17 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar17 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar21) {
        local_108.field_2._M_allocated_capacity = *psVar21;
        local_108.field_2._8_8_ = puVar17[3];
        local_108._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar21;
        local_108._M_dataplus._M_p = (pointer)*puVar17;
      }
      local_108._M_string_length = puVar17[1];
      *puVar17 = psVar21;
      puVar17[1] = 0;
      *(undefined1 *)(puVar17 + 2) = 0;
      puVar17 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)&local_108,(ulong)(name->_M_dataplus)._M_p);
      paVar3 = &local_128.field_2;
      psVar21 = puVar17 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar17 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar21) {
        local_128.field_2._M_allocated_capacity = *psVar21;
        local_128.field_2._8_8_ = puVar17[3];
        local_128._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_128.field_2._M_allocated_capacity = *psVar21;
        local_128._M_dataplus._M_p = (pointer)*puVar17;
      }
      local_128._M_string_length = puVar17[1];
      *puVar17 = psVar21;
      puVar17[1] = 0;
      *(undefined1 *)(puVar17 + 2) = 0;
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_128);
      msg._M_dataplus._M_p = (pointer)&msg.field_2;
      psVar21 = (size_type *)(plVar16 + 2);
      if ((size_type *)*plVar16 == psVar21) {
        msg.field_2._M_allocated_capacity = *psVar21;
        msg.field_2._8_8_ = plVar16[3];
      }
      else {
        msg.field_2._M_allocated_capacity = *psVar21;
        msg._M_dataplus._M_p = (pointer)*plVar16;
      }
      msg._M_string_length = plVar16[1];
      *plVar16 = (long)psVar21;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar3) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      paVar4 = &local_e8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar4) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      std::__cxx11::string::append((char *)&msg);
      local_128._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Core","");
      local_108._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"IO","");
      local_e8._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Open","");
      helper::Throw<std::runtime_error>(&local_128,&local_108,&local_e8,&msg,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar4) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      MVar22 = local_c4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar3) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p);
      }
    }
    if (p_Var7 != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7);
    }
  }
LAB_0037532e:
  if (MVar22 == ReadRandomAccess) {
    cVar18 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(anonymous_namespace)::ReadRandomAccess_Supported_abi_cxx11_,&engineTypeLC);
    if (cVar18.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
        ._M_cur == (__node_type *)0x0) {
      MVar22 = ReadRandomAccess;
    }
    else {
      MVar22 = (uint)*(byte *)((long)cVar18.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
                                     ._M_cur + 0x28) * 2 + Read;
    }
  }
  iVar13 = pthread_mutex_lock((pthread_mutex_t *)(anonymous_namespace)::FactoryMutex);
  if (iVar13 == 0) {
    iVar19 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(anonymous_namespace)::Factory_abi_cxx11_,&engineTypeLC);
    pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::FactoryMutex);
    if (iVar19.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_true>
        ._M_cur == (__node_type *)0x0) {
      msg._M_dataplus._M_p = (pointer)&msg.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&msg,"Core","");
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"IO","");
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Open","");
      std::operator+(&local_50,"Engine type ",&this->m_EngineType);
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_50);
      psVar21 = (size_type *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar21) {
        local_e8.field_2._M_allocated_capacity = *psVar21;
        local_e8.field_2._8_8_ = plVar16[3];
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar21;
        local_e8._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_e8._M_string_length = plVar16[1];
      *plVar16 = (long)psVar21;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      helper::Throw<std::invalid_argument>(&msg,&local_128,&local_108,&local_e8,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p);
      }
    }
    else {
      if ((local_68 == (char *)0x0) || (MVar22 != ReadRandomAccess)) {
        if ((MVar22 == ReadRandomAccess) || (MVar22 == Read)) {
          helper::Comm::Comm(&local_78,local_c0);
          local_128._M_dataplus._M_p._0_4_ = MVar22;
          if (*(long *)((long)iVar19.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_true>
                              ._M_cur + 0x38) == 0) {
            std::__throw_bad_function_call();
          }
          (**(code **)((long)iVar19.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_true>
                             ._M_cur + 0x40))
                    (&msg,(long)iVar19.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_true>
                                ._M_cur + 0x28,this,name,&local_128,&local_78);
          _Var11._M_pi = local_98.
                         super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          local_98.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)msg._M_string_length;
          local_98.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)msg._M_dataplus;
          msg._M_dataplus._M_p = (pointer)0x0;
          msg._M_string_length = 0;
          if (_Var11._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var11._M_pi);
          }
          if (msg._M_string_length != 0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)msg._M_string_length);
          }
          this_00 = &local_78;
        }
        else {
          helper::Comm::Comm(&local_80,local_c0);
          local_128._M_dataplus._M_p._0_4_ = MVar22;
          if (*(long *)((long)iVar19.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_true>
                              ._M_cur + 0x58) == 0) {
            std::__throw_bad_function_call();
          }
          (**(code **)((long)iVar19.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_true>
                             ._M_cur + 0x60))
                    (&msg,(long)iVar19.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_true>
                                ._M_cur + 0x48,this,name,&local_128,&local_80);
          _Var11._M_pi = local_98.
                         super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          local_98.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)msg._M_string_length;
          local_98.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)msg._M_dataplus;
          msg._M_dataplus._M_p = (pointer)0x0;
          msg._M_string_length = 0;
          if (_Var11._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var11._M_pi);
          }
          if (msg._M_string_length != 0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)msg._M_string_length);
          }
          this_00 = &local_80;
        }
      }
      else {
        helper::Comm::Comm(&local_70,local_c0);
        std::
        function<std::shared_ptr<adios2::core::Engine>_(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm,_const_char_*,_unsigned_long)>
        ::operator()((function<std::shared_ptr<adios2::core::Engine>_(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm,_const_char_*,_unsigned_long)>
                      *)&msg,(IO *)((long)iVar19.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_true>
                                          ._M_cur + 0x68),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (Mode)name,(Comm *)0x4,(char *)&local_70,(unsigned_long)local_68);
        _Var11._M_pi = local_98.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
        local_98.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)msg._M_string_length;
        local_98.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)msg._M_dataplus;
        msg._M_dataplus._M_p = (pointer)0x0;
        msg._M_string_length = 0;
        if (_Var11._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var11._M_pi);
        }
        if (msg._M_string_length != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)msg._M_string_length);
        }
        this_00 = &local_70;
      }
      helper::Comm::~Comm(this_00);
    }
    pVar25 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>>>
             ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<adios2::core::Engine>>
                       (local_88,name,&local_98);
    if (((undefined1  [16])pVar25 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      msg._M_dataplus._M_p = (pointer)&msg.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&msg,"Core","");
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"IO","");
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Open","");
      std::operator+(&local_e8,"failed to create Engine ",&this->m_EngineType);
      helper::Throw<std::invalid_argument>(&msg,&local_128,&local_108,&local_e8,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p);
      }
    }
    pEVar8 = *(Engine **)(pVar25.first._M_node._M_node + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)engineTypeLC._M_dataplus._M_p != &engineTypeLC.field_2) {
      operator_delete(engineTypeLC._M_dataplus._M_p);
    }
    if (local_98.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2535);
    return pEVar8;
  }
  std::__throw_system_error(iVar13);
}

Assistant:

Engine &IO::Open(const std::string &name, const Mode mode, helper::Comm comm, const char *md,
                 const size_t mdsize)
{
    PERFSTUBS_SCOPED_TIMER("IO::Open");
    auto itEngineFound = m_Engines.find(name);
    const bool isEngineFound = (itEngineFound != m_Engines.end());
    bool isEngineActive = false;
    Mode mode_to_use = mode;

    if (isEngineFound)
    {
        if (*itEngineFound->second)
        {
            isEngineActive = true;
        }
    }

    if (isEngineFound)
    {
        if (isEngineActive) // check if active
        {
            helper::Throw<std::invalid_argument>("Core", "IO", "Open",
                                                 "Engine " + name + " is opened twice");
        }
    }

    if (isEngineFound)
    {
        if (!isEngineActive)
        {
            m_Engines.erase(name);
        }
    }

    std::shared_ptr<Engine> engine;
    const bool isDefaultEngine = m_EngineType.empty() ? true : false;
    std::string engineTypeLC = m_EngineType;
    if (!isDefaultEngine)
    {
        std::transform(engineTypeLC.begin(), engineTypeLC.end(), engineTypeLC.begin(), ::tolower);
    }

    /* Second step in handling virtual engines */
    /* BPFile for read needs to use BP5, BP4, or BP3 depending on the file's
     * version
     */
    if ((engineTypeLC == "file" || engineTypeLC == "bpfile" || engineTypeLC == "bp" ||
         isDefaultEngine))
    {
        if (helper::EndsWith(name, ".h5", false))
        {
            engineTypeLC = "hdf5";
        }
        else if (helper::EndsWith(name, ".aca", false))
        {
            engineTypeLC = "campaign";
        }
        else if ((mode_to_use == Mode::Read) || (mode_to_use == Mode::ReadRandomAccess))
        {
            if (adios2sys::SystemTools::FileIsDirectory(name))
            {
                char v = helper::BPVersion(name, comm, m_TransportsParameters);
                engineTypeLC = "bp";
                engineTypeLC.push_back(v);
            }
            else if (adios2sys::SystemTools::FileIsDirectory(name + ".tier0"))
            {
                engineTypeLC = "mhs";
            }
            else
            {
                if (helper::EndsWith(name, ".bp", false))
                {
                    engineTypeLC = "bp3";
                }
                else
                {
                    /* We need to figure out the type of file
                     * from the file itself
                     */
                    if (helper::IsHDF5File(name, *this, comm, m_TransportsParameters))
                    {
                        engineTypeLC = "hdf5";
                    }
                    else
                    {
                        engineTypeLC = "bp3";
                    }
                }
            }
        }
        else
        {
            // File default for writing: BP5
            engineTypeLC = "bp5";
        }
    }

    /* Note: Mismatch between BP4/BP5 writer and FileStream reader is not
       handled if writer has not created the directory yet, when FileStream
       falls back to default (BP4) */
    if (engineTypeLC == "filestream")
    {
        char v = helper::BPVersion(name, comm, m_TransportsParameters);
        engineTypeLC = "bp";
        engineTypeLC.push_back(v);
        // std::cout << "Engine " << engineTypeLC << " selected for FileStream"
        //          << std::endl;
    }

    // For the inline engine, there must be exactly 1 reader, and exactly 1
    // writer.
    if (engineTypeLC == "inline")
    {
        if (mode_to_use == Mode::Append)
        {
            helper::Throw<std::runtime_error>("Core", "IO", "Open",
                                              "Append mode is not supported in the inline engine.");
        }

        // See inline.rst:44
        if (mode_to_use == Mode::Sync)
        {
            helper::Throw<std::runtime_error>("Core", "IO", "Open",
                                              "Sync mode is not supported in the inline engine.");
        }

        if (m_Engines.size() >= 2)
        {
            std::string msg = "Failed to add engine " + name + " to IO \'" + m_Name + "\'. ";
            msg += "An inline engine must have exactly one writer, and one "
                   "reader. ";
            msg += "There are already two engines declared, so no more can be "
                   "added.";
            helper::Throw<std::runtime_error>("Core", "IO", "Open", msg);
        }
        // Now protect against declaration of two writers, or declaration of
        // two readers:
        if (m_Engines.size() == 1)
        {
            auto engine_ptr = m_Engines.begin()->second;
            if (engine_ptr->OpenMode() == mode_to_use)
            {
                std::string msg = "The previously added engine " + engine_ptr->m_Name +
                                  " is already opened in same mode requested for " + name + ". ";
                msg += "The inline engine requires exactly one writer and one "
                       "reader.";
                helper::Throw<std::runtime_error>("Core", "IO", "Open", msg);
            }
        }
    }

    if (mode_to_use == Mode::ReadRandomAccess)
    {
        // older engines don't know about ReadRandomAccess Mode
        auto it = ReadRandomAccess_Supported.find(engineTypeLC);
        if (it != ReadRandomAccess_Supported.end())
        {
            if (!it->second)
            {
                mode_to_use = Mode::Read;
            }
        }
    }

    auto f = FactoryLookup(engineTypeLC);
    if (f != Factory.end())
    {
        if (md && mode_to_use == Mode::ReadRandomAccess)
        {
            engine =
                f->second.MakeReaderWithMD(*this, name, mode_to_use, std::move(comm), md, mdsize);
        }
        else if ((mode_to_use == Mode::Read) || (mode_to_use == Mode::ReadRandomAccess))
        {
            engine = f->second.MakeReader(*this, name, mode_to_use, std::move(comm));
        }
        else
        {
            engine = f->second.MakeWriter(*this, name, mode_to_use, std::move(comm));
        }
    }
    else
    {
        helper::Throw<std::invalid_argument>("Core", "IO", "Open",
                                             "Engine type " + m_EngineType + " is not valid");
    }

    auto itEngine = m_Engines.emplace(name, std::move(engine));

    if (!itEngine.second)
    {
        helper::Throw<std::invalid_argument>("Core", "IO", "Open",
                                             "failed to create Engine " + m_EngineType);
    }
    // return a reference
    return *itEngine.first->second.get();
}